

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O1

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<register_has_no_reset::MainVisitor&>
          (RangeSelectExpression *this,AlwaysFFVisitor *visitor)

{
  Expression::visitExpression<slang::ast::Expression_const,register_has_no_reset::MainVisitor&>
            (this->value_,this->value_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,register_has_no_reset::MainVisitor&>
            (this->left_,this->left_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,register_has_no_reset::MainVisitor&>
            (this->right_,this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }